

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

LossParameter * __thiscall caffe::V1LayerParameter::mutable_loss_param(V1LayerParameter *this)

{
  LossParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_loss_param(this);
  if (this->loss_param_ == (LossParameter *)0x0) {
    this_00 = (LossParameter *)operator_new(0x28);
    LossParameter::LossParameter(this_00);
    this->loss_param_ = this_00;
  }
  return this->loss_param_;
}

Assistant:

inline ::caffe::LossParameter* V1LayerParameter::mutable_loss_param() {
  set_has_loss_param();
  if (loss_param_ == NULL) {
    loss_param_ = new ::caffe::LossParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.loss_param)
  return loss_param_;
}